

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementTetraCorot_4::ComputeNF
          (ChElementTetraCorot_4 *this,double U,double V,double W,ChVectorDynamic<> *Qi,double *detJ
          ,ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double dVar1;
  double dVar2;
  CoeffReturnType pdVar3;
  Scalar *pSVar4;
  
  dVar2 = ((1.0 - U) - V) - W;
  *detJ = this->Volume * 6.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,0);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,0);
  *pSVar4 = dVar2 * dVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,1);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,1);
  *pSVar4 = dVar2 * dVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,2);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,2);
  *pSVar4 = dVar2 * dVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,0);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,3);
  *pSVar4 = U * dVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,1);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,4);
  *pSVar4 = U * dVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,2);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,5);
  *pSVar4 = U * dVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,0);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,6);
  *pSVar4 = V * dVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,1);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,7);
  *pSVar4 = V * dVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,2);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,8);
  *pSVar4 = V * dVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,0);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,9);
  *pSVar4 = W * dVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,1);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,10);
  *pSVar4 = W * dVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,2);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,0xb);
  *pSVar4 = W * dVar1;
  return;
}

Assistant:

void ChElementTetraCorot_4::ComputeNF(const double U,
                                      const double V,
                                      const double W,
                                      ChVectorDynamic<>& Qi,
                                      double& detJ,
                                      const ChVectorDynamic<>& F,
                                      ChVectorDynamic<>* state_x,
                                      ChVectorDynamic<>* state_w) {
    // evaluate shape functions (in compressed vector), btw. not dependent on state
    // note: U,V,W in 0..1 range, thanks to IsTetrahedronIntegrationNeeded() {return true;}
    ShapeVector N;
    this->ShapeFunctions(N, U, V, W);

    detJ = 6 * this->GetVolume();

    Qi(0) = N(0) * F(0);
    Qi(1) = N(0) * F(1);
    Qi(2) = N(0) * F(2);
    Qi(3) = N(1) * F(0);
    Qi(4) = N(1) * F(1);
    Qi(5) = N(1) * F(2);
    Qi(6) = N(2) * F(0);
    Qi(7) = N(2) * F(1);
    Qi(8) = N(2) * F(2);
    Qi(9) = N(3) * F(0);
    Qi(10) = N(3) * F(1);
    Qi(11) = N(3) * F(2);
}